

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QTimeEdit::QTimeEdit(QTimeEdit *this,QTime time,QWidget *parent)

{
  char cVar1;
  long in_FS_OFFSET;
  undefined1 local_50 [8];
  QTime local_48;
  QTime time_local;
  code *local_40 [4];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  time_local = time;
  cVar1 = QTime::isValid();
  if (cVar1 == '\0') {
    QTime::QTime(&local_48,0,0,0,0);
  }
  else {
    local_48.mds = time_local.mds;
  }
  ::QVariant::QVariant((QVariant *)local_40,local_48);
  QDateTimeEdit::QDateTimeEdit(&this->super_QDateTimeEdit,(QVariant *)local_40,QTime,parent);
  ::QVariant::~QVariant((QVariant *)local_40);
  *(undefined ***)&(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget =
       &PTR_metaObject_007cb068;
  *(undefined ***)
   &(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget.super_QPaintDevice =
       &PTR__QTimeEdit_007cb258;
  local_40[0] = userTimeChanged;
  local_40[1] = (code *)0x0;
  QObject::connect<void(QDateTimeEdit::*)(QTime),void(QTimeEdit::*)(QTime)>
            ((Object *)local_50,(offset_in_QDateTimeEdit_to_subr)this,
             (ContextType *)QDateTimeEdit::timeChanged,(offset_in_QTimeEdit_to_subr *)0x0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTimeEdit::QTimeEdit(QTime time, QWidget *parent)
    : QDateTimeEdit(time.isValid() ? time : QDATETIMEEDIT_TIME_MIN, QMetaType::QTime, parent)
{
    connect(this, &QTimeEdit::timeChanged, this, &QTimeEdit::userTimeChanged);
}